

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

bool Validator::constraintH3(Solution *solution)

{
  Turn *this;
  pointer pbVar1;
  pointer pbVar2;
  pointer ppTVar3;
  int iVar4;
  int iVar5;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__x;
  vector<Turn_*,_std::allocator<Turn_*>_> *__x_00;
  Nurse *this_00;
  History *this_01;
  string *psVar6;
  Scenario *pSVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar8;
  mapped_type *pmVar9;
  ShiftType *pSVar10;
  key_type *__k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  _Base_ptr p_Var13;
  pointer ppTVar14;
  vector<Turn_*,_std::allocator<Turn_*>_> turns;
  ShiftType lastShift;
  string lastShiftString;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  nurses;
  
  __x = &Solution::getNurses_abi_cxx11_(solution)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::_Rb_tree(&nurses._M_t,__x);
  p_Var13 = nurses._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var13 == &nurses._M_t._M_impl.super__Rb_tree_header) {
LAB_00111019:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
      ::~_Rb_tree(&nurses._M_t);
      return (_Rb_tree_header *)p_Var13 == &nurses._M_t._M_impl.super__Rb_tree_header;
    }
    __x_00 = NurseSolution::getTurns(*(NurseSolution **)(p_Var13 + 2));
    std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&turns,__x_00);
    this_00 = NurseSolution::getNurse(*(NurseSolution **)(p_Var13 + 2));
    this_01 = Nurse::getHistory(this_00);
    psVar6 = History::getLastAssignedShiftType_abi_cxx11_(this_01);
    std::__cxx11::string::string((string *)&lastShiftString,(string *)psVar6);
    lastShift.id._M_dataplus._M_p = (pointer)&lastShift.id.field_2;
    lastShift.id._M_string_length = 0;
    lastShift.id.field_2._M_local_buf[0] = '\0';
    lastShift.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    lastShift.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lastShift.forbiddenSucceedingShiftTypes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar7 = Scenario::getInstance();
    pmVar8 = Scenario::getShifts_abi_cxx11_(pSVar7);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
             ::at(pmVar8,&lastShiftString);
    ShiftType::operator=(&lastShift,pmVar9);
    ppTVar3 = turns.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    iVar5 = -1;
    for (ppTVar14 = turns.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppTVar14 != ppTVar3; ppTVar14 = ppTVar14 + 1)
    {
      this = *ppTVar14;
      if (iVar5 == -2) {
        pSVar7 = Scenario::getInstance();
        pmVar8 = Scenario::getShifts_abi_cxx11_(pSVar7);
        pSVar10 = Turn::getShiftType(this);
        __k = ShiftType::getId_abi_cxx11_(pSVar10);
      }
      else {
        pvVar11 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&lastShift);
        pbVar1 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&lastShift);
        pbVar2 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pSVar10 = Turn::getShiftType(this);
        psVar6 = ShiftType::getId_abi_cxx11_(pSVar10);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (pbVar1,pbVar2,psVar6);
        pvVar11 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&lastShift);
        if (_Var12._M_current !=
            (pvVar11->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          iVar4 = Turn::getDay(this);
          if (iVar5 == iVar4 + -1) {
            ShiftType::~ShiftType(&lastShift);
            std::__cxx11::string::~string((string *)&lastShiftString);
            std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
                      (&turns.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
            goto LAB_00111019;
          }
        }
        pSVar7 = Scenario::getInstance();
        pmVar8 = Scenario::getShifts_abi_cxx11_(pSVar7);
        pSVar10 = Turn::getShiftType(this);
        __k = ShiftType::getId_abi_cxx11_(pSVar10);
      }
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
               ::at(pmVar8,__k);
      ShiftType::operator=(&lastShift,pmVar9);
      iVar5 = Turn::getDay(this);
    }
    ShiftType::~ShiftType(&lastShift);
    std::__cxx11::string::~string((string *)&lastShiftString);
    std::_Vector_base<Turn_*,_std::allocator<Turn_*>_>::~_Vector_base
              (&turns.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>);
    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
  } while( true );
}

Assistant:

bool Validator::constraintH3(const Solution &solution) {
    map<string, NurseSolution *> nurses = solution.getNurses();
    for(auto const &nurse : nurses)
    {
        vector<Turn *> turns = nurse.second->getTurns();

        string lastShiftString = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

        int lastDay;
        ShiftType lastShift;

        try {

            lastShift = Scenario::getInstance()->getShifts().at(lastShiftString);
            lastDay = -1;
        }
        catch(const std::exception& e)
        {
            lastDay = -2;
        }

        for(Turn * turn : turns){
            if(lastDay == -2) {
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else if(find(lastShift.getForbiddenSucceedingShiftTypes().begin(), lastShift.getForbiddenSucceedingShiftTypes().end(), turn->getShiftType()->getId()) == lastShift.getForbiddenSucceedingShiftTypes().end()
               || lastDay != (turn->getDay() - 1)){
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else
            {
                return false;
            }
        }
    }
    return true;
}